

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableView::setSelection(QTableView *this,QRect *rect,SelectionFlags command)

{
  long *plVar1;
  long lVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  LayoutDirection LVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined8 *puVar18;
  undefined1 **ppuVar19;
  ulong uVar20;
  int visual;
  int visualIndex;
  QTableViewPrivate *pQVar21;
  long *plVar22;
  long in_FS_OFFSET;
  SpanList *__range3;
  int local_128;
  ulong local_120;
  QModelIndex local_f0;
  QModelIndex local_d8;
  QModelIndex local_b8;
  QArrayDataPointer<QItemSelectionRange> local_98;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  LVar10 = QWidget::layoutDirection((QWidget *)this);
  iVar11 = (rect->x1).m_i;
  if (LVar10 == RightToLeft) {
    local_98.d = (Data *)CONCAT44(local_98.d._4_4_,iVar11);
    local_b8.r = (rect->x2).m_i;
    puVar18 = &local_98.d;
    if (iVar11 < local_b8.r) {
      puVar18 = (undefined8 *)&local_b8;
    }
  }
  else {
    local_98.d = (Data *)CONCAT44(local_98.d._4_4_,iVar11);
    local_b8.r = (rect->x2).m_i;
    puVar18 = (undefined8 *)&local_b8;
    if (iVar11 < local_b8.r) {
      puVar18 = &local_98.d;
    }
  }
  local_98.d = (Data *)CONCAT44(local_98.d._4_4_,iVar11);
  iVar11 = (rect->y1).m_i;
  local_78.c = (rect->y2).m_i;
  if (iVar11 < local_78.c) {
    local_78.c = iVar11;
  }
  local_78.r = *(int *)puVar18;
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x1f0))(&local_58,this,&local_78);
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  LVar10 = QWidget::layoutDirection((QWidget *)this);
  local_b8.r = (rect->x1).m_i;
  if (LVar10 == RightToLeft) {
    local_d8.r = (rect->x2).m_i;
    ppuVar19 = (undefined1 **)&local_d8;
    if (local_b8.r < local_d8.r) {
      ppuVar19 = (undefined1 **)&local_b8;
    }
  }
  else {
    local_d8.r = (rect->x2).m_i;
    ppuVar19 = (undefined1 **)&local_b8;
    if (local_b8.r < local_d8.r) {
      ppuVar19 = (undefined1 **)&local_d8;
    }
  }
  iVar11 = (rect->y1).m_i;
  iVar14 = (rect->y2).m_i;
  if (iVar14 < iVar11) {
    iVar14 = iVar11;
  }
  local_98.d = (Data *)CONCAT44(iVar14,*(undefined4 *)ppuVar19);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x1f0))(&local_78,this);
  if ((((((*(long *)(lVar2 + 800) == 0) || (*(int *)(*(long *)(lVar2 + 800) + 4) == 0)) ||
        (*(long *)(lVar2 + 0x328) == 0)) ||
       (((local_58.r < 0 || ((long)local_58._0_8_ < 0)) ||
        ((local_58.m.ptr == (QAbstractItemModel *)0x0 ||
         ((local_78.r < 0 || ((long)local_78._0_8_ < 0)))))))) ||
      (local_78.m.ptr == (QAbstractItemModel *)0x0)) ||
     ((uVar20 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x138))
                          (*(long **)(lVar2 + 0x2f8),&local_58), (uVar20 & 0x20) == 0 ||
      (uVar20 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x138))
                          (*(long **)(lVar2 + 0x2f8),&local_78), (uVar20 & 0x20) == 0))))
  goto LAB_005891d9;
  bVar6 = QHeaderView::sectionsMoved
                    (*(QHeaderView **)
                      (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget.field_0x8 + 0x588));
  bVar7 = QHeaderView::sectionsMoved
                    (*(QHeaderView **)
                      (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget.field_0x8 + 0x580));
  local_98.d = (Data *)0x0;
  local_98.ptr = (QItemSelectionRange *)0x0;
  local_98.size = 0;
  local_128 = local_58.r;
  plVar1 = (long *)(lVar2 + 0x650);
  if (*(long **)(lVar2 + 0x650) == plVar1) {
    if (bVar6 && bVar7) {
      local_128 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_58.r);
      uVar13 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_78.r);
      uVar20 = (ulong)uVar13;
      uVar13 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_58.c);
      local_120 = (ulong)uVar13;
      iVar11 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_78.c);
      goto LAB_00588c48;
    }
    if (bVar7) {
      uVar20 = local_78._0_8_ & 0xffffffff;
      iVar14 = local_78.r;
      uVar13 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_58.c);
      local_120 = (ulong)uVar13;
      iVar11 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_78.c);
      if (!bVar6) goto LAB_00588e1d;
      goto LAB_00588c50;
    }
    if (!bVar6) goto LAB_00589133;
    local_128 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_58.r);
    iVar14 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_78.r);
    local_120 = (ulong)local_58._0_8_ >> 0x20;
    iVar11 = local_78.c;
LAB_00588fd0:
    QList<QItemSelectionRange>::reserve
              ((QList<QItemSelectionRange> *)&local_98,(long)((iVar14 - local_128) + 1));
    if (local_128 <= iVar14) {
      do {
        iVar15 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar2 + 0x588),local_128);
        local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        plVar1 = *(long **)(lVar2 + 0x2f8);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_d8,(QPersistentModelIndex *)(lVar2 + 0x3b8));
        (**(code **)(*plVar1 + 0x60))(&local_b8,plVar1,iVar15,local_120,&local_d8);
        local_d8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        plVar1 = *(long **)(lVar2 + 0x2f8);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_f0,(QPersistentModelIndex *)(lVar2 + 0x3b8));
        (**(code **)(*plVar1 + 0x60))(&local_d8,plVar1,iVar15,iVar11,&local_f0);
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_f0,&local_b8);
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_f0.i,&local_d8)
        ;
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)&local_98,local_98.size,
                   (QItemSelectionRange *)&local_f0);
        QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_98);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_f0.i);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_f0);
        local_128 = local_128 + 1;
      } while (iVar14 + 1 != local_128);
    }
  }
  else {
    iVar11 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_58.r);
    local_128 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_78.r);
    if (iVar11 < local_128) {
      local_128 = iVar11;
    }
    uVar12 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_58.c);
    uVar13 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_78.c);
    if ((int)uVar12 < (int)uVar13) {
      uVar13 = uVar12;
    }
    local_120 = (ulong)uVar13;
    uVar12 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_58.r);
    uVar13 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_78.r);
    if ((int)uVar13 < (int)uVar12) {
      uVar13 = uVar12;
    }
    uVar20 = (ulong)uVar13;
    iVar14 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_58.c);
    iVar11 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_78.c);
    if (iVar11 < iVar14) {
      iVar11 = iVar14;
    }
    bVar8 = false;
    do {
      plVar22 = (long *)*plVar1;
      if (plVar22 == plVar1) break;
      bVar5 = false;
      bVar4 = false;
      do {
        piVar3 = (int *)plVar22[2];
        iVar14 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),*piVar3);
        pQVar21 = *(QTableViewPrivate **)(lVar2 + 0x580);
        uVar13 = QHeaderView::visualIndex((QHeaderView *)pQVar21,piVar3[1]);
        iVar15 = QTableViewPrivate::sectionSpanEndLogical
                           (pQVar21,*(QHeaderView **)(lVar2 + 0x588),*piVar3,
                            (piVar3[2] - *piVar3) + 1);
        pQVar21 = *(QTableViewPrivate **)(lVar2 + 0x588);
        uVar12 = QHeaderView::visualIndex((QHeaderView *)pQVar21,iVar15);
        iVar15 = QTableViewPrivate::sectionSpanEndLogical
                           (pQVar21,*(QHeaderView **)(lVar2 + 0x580),piVar3[1],
                            (piVar3[3] - piVar3[1]) + 1);
        iVar15 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),iVar15);
        if ((((iVar14 <= (int)uVar20) && ((int)uVar13 <= iVar11)) && (local_128 <= (int)uVar12)) &&
           ((int)local_120 <= iVar15)) {
          iVar16 = local_128;
          if (iVar14 < local_128) {
            iVar16 = iVar14;
          }
          if (iVar14 < local_128) {
            bVar5 = true;
          }
          if ((int)uVar13 < (int)local_120) {
            local_120 = (ulong)uVar13;
            bVar5 = true;
          }
          if ((int)uVar20 < (int)uVar12) {
            uVar20 = (ulong)uVar12;
            bVar5 = true;
          }
          bVar4 = bVar5;
          if (iVar11 < iVar15) {
            iVar11 = iVar15;
            bVar4 = true;
          }
          bVar8 = true;
          local_128 = iVar16;
          bVar5 = bVar4;
          if (bVar4) break;
        }
        plVar22 = (long *)*plVar22;
      } while (plVar22 != plVar1);
    } while (bVar4);
    if (bVar8) {
      if (bVar6) goto LAB_00588c48;
      if (bVar7) {
LAB_00588e1d:
        QList<QItemSelectionRange>::reserve
                  ((QList<QItemSelectionRange> *)&local_98,(long)((iVar11 - (int)local_120) + 1));
        if ((int)local_120 <= iVar11) {
          do {
            iVar14 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar2 + 0x580),(int)local_120);
            local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
            plVar1 = *(long **)(lVar2 + 0x2f8);
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      (&local_d8,(QPersistentModelIndex *)(lVar2 + 0x3b8));
            (**(code **)(*plVar1 + 0x60))(&local_b8,plVar1,local_128,iVar14,&local_d8);
            local_d8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_d8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
            plVar1 = *(long **)(lVar2 + 0x2f8);
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      (&local_f0,(QPersistentModelIndex *)(lVar2 + 0x3b8));
            (**(code **)(*plVar1 + 0x60))(&local_d8,plVar1,uVar20,iVar14,&local_f0);
            QPersistentModelIndex::QPersistentModelIndex
                      ((QPersistentModelIndex *)&local_f0,&local_b8);
            QPersistentModelIndex::QPersistentModelIndex
                      ((QPersistentModelIndex *)&local_f0.i,&local_d8);
            QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                      ((QMovableArrayOps<QItemSelectionRange> *)&local_98,local_98.size,
                       (QItemSelectionRange *)&local_f0);
            QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_98);
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_f0.i);
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_f0);
            uVar13 = (int)local_120 + 1;
            local_120 = (ulong)uVar13;
          } while (iVar11 + 1U != uVar13);
        }
        goto LAB_005891a9;
      }
      plVar1 = *(long **)(lVar2 + 0x2f8);
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_d8,(QPersistentModelIndex *)(lVar2 + 0x3b8));
      (**(code **)(*plVar1 + 0x60))(&local_b8,plVar1,local_128,local_120,&local_d8);
      local_58.m.ptr = local_b8.m.ptr;
      local_58.r = local_b8.r;
      local_58.c = local_b8.c;
      local_58.i = local_b8.i;
      plVar1 = *(long **)(lVar2 + 0x2f8);
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_d8,(QPersistentModelIndex *)(lVar2 + 0x3b8));
      (**(code **)(*plVar1 + 0x60))(&local_b8,plVar1,uVar20,iVar11,&local_d8);
      local_78.m.ptr = local_b8.m.ptr;
      local_78.r = local_b8.r;
      local_78.c = local_b8.c;
      local_78.i = local_b8.i;
    }
    else {
      local_120 = (ulong)local_58._0_8_ >> 0x20;
      uVar20 = local_78._0_8_ & 0xffffffff;
      local_128 = local_58.r;
      iVar11 = local_78.c;
LAB_00588c48:
      iVar14 = (int)uVar20;
      if (bVar6 && bVar7) {
LAB_00588c50:
        QList<QItemSelectionRange>::reserve
                  ((QList<QItemSelectionRange> *)&local_98,
                   (long)(((iVar14 - local_128) + 1) * ((iVar11 - (int)local_120) + 1)));
        if ((int)local_120 <= iVar11) {
          do {
            visualIndex = (int)local_120;
            iVar16 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar2 + 0x580),visualIndex);
            iVar15 = local_128;
            if (local_128 <= iVar14) {
              do {
                iVar17 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar2 + 0x588),iVar15);
                local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
                plVar1 = *(long **)(lVar2 + 0x2f8);
                QPersistentModelIndex::operator_cast_to_QModelIndex
                          (&local_d8,(QPersistentModelIndex *)(lVar2 + 0x3b8));
                (**(code **)(*plVar1 + 0x60))(&local_b8,plVar1,iVar17,iVar16,&local_d8);
                QPersistentModelIndex::QPersistentModelIndex
                          ((QPersistentModelIndex *)&local_d8,&local_b8);
                QPersistentModelIndex::QPersistentModelIndex
                          ((QPersistentModelIndex *)&local_d8.i,(QPersistentModelIndex *)&local_d8);
                QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                          ((QMovableArrayOps<QItemSelectionRange> *)&local_98,local_98.size,
                           (QItemSelectionRange *)&local_d8);
                QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_98);
                QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_d8.i);
                QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_d8);
                iVar15 = iVar15 + 1;
              } while (iVar14 + 1 != iVar15);
            }
            local_120 = (ulong)(visualIndex + 1);
          } while (visualIndex != iVar11);
        }
        goto LAB_005891a9;
      }
      if (bVar7) goto LAB_00588e1d;
      if (bVar6) goto LAB_00588fd0;
    }
LAB_00589133:
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_b8,&local_58);
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_b8.i,&local_78);
    cVar9 = QItemSelectionRange::isEmpty();
    if (cVar9 == '\0') {
      QList<QItemSelectionRange>::append
                ((QList<QItemSelectionRange> *)&local_98,(parameter_type)&local_b8);
    }
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8.i);
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8);
  }
LAB_005891a9:
  (**(code **)(**(long **)(lVar2 + 0x328) + 0x70))
            (*(long **)(lVar2 + 0x328),&local_98,
             command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_98);
LAB_005891d9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::setSelection(const QRect &rect, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QTableView);
    QModelIndex tl = indexAt(QPoint(isRightToLeft() ? qMax(rect.left(), rect.right())
                                    : qMin(rect.left(), rect.right()), qMin(rect.top(), rect.bottom())));
    QModelIndex br = indexAt(QPoint(isRightToLeft() ? qMin(rect.left(), rect.right()) :
                                    qMax(rect.left(), rect.right()), qMax(rect.top(), rect.bottom())));
    if (!d->selectionModel || !tl.isValid() || !br.isValid() || !d->isIndexEnabled(tl) || !d->isIndexEnabled(br))
        return;

    const bool verticalMoved = verticalHeader()->sectionsMoved();
    const bool horizontalMoved = horizontalHeader()->sectionsMoved();

    QItemSelection selection;
    int top = tl.row();
    int bottom = br.row();
    int left = tl.column();
    int right = br.column();

    if (d->hasSpans()) {
        bool expanded;
        // when the current selection does not intersect with any spans of merged cells,
        // the range of selected cells must be the same as if there were no merged cells
        bool intersectsSpan = false;
        top = qMin(d->visualRow(tl.row()), d->visualRow(br.row()));
        left = qMin(d->visualColumn(tl.column()), d->visualColumn(br.column()));
        bottom = qMax(d->visualRow(tl.row()), d->visualRow(br.row()));
        right = qMax(d->visualColumn(tl.column()), d->visualColumn(br.column()));
        do {
            expanded = false;
            for (QSpanCollection::Span *it : d->spans.spans) {
                const QSpanCollection::Span &span = *it;
                const int t = d->visualRow(span.top());
                const int l = d->visualColumn(span.left());
                const int b = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
                const int r = d->visualColumn(d->columnSpanEndLogical(span.left(), span.width()));
                if ((t > bottom) || (l > right) || (top > b) || (left > r))
                    continue; // no intersect
                intersectsSpan = true;
                if (t < top) {
                    top = t;
                    expanded = true;
                }
                if (l < left) {
                    left = l;
                    expanded = true;
                }
                if (b > bottom) {
                    bottom = b;
                    expanded = true;
                }
                if (r > right) {
                    right = r;
                    expanded = true;
                }
                if (expanded)
                    break;
            }
        } while (expanded);
        if (!intersectsSpan) {
            top = tl.row();
            bottom = br.row();
            left = tl.column();
            right = br.column();
        } else if (!verticalMoved && !horizontalMoved) {
            // top/left/bottom/right are visual, update indexes
            tl = d->model->index(top, left, d->root);
            br = d->model->index(bottom, right, d->root);
        }
    } else if (verticalMoved && horizontalMoved) {
         top = d->visualRow(tl.row());
         bottom = d->visualRow(br.row());
         left = d->visualColumn(tl.column());
         right = d->visualColumn(br.column());
    } else if (horizontalMoved) {
        top = tl.row();
        bottom = br.row();
        left = d->visualColumn(tl.column());
        right = d->visualColumn(br.column());
    } else if (verticalMoved) {
        top = d->visualRow(tl.row());
        bottom = d->visualRow(br.row());
        left = tl.column();
        right = br.column();
    }

    if (horizontalMoved && verticalMoved) {
         selection.reserve((right - left + 1) * (bottom - top + 1));
         for (int horizontal = left; horizontal <= right; ++horizontal) {
             int column = d->logicalColumn(horizontal);
             for (int vertical = top; vertical <= bottom; ++vertical) {
                 int row = d->logicalRow(vertical);
                 QModelIndex index = d->model->index(row, column, d->root);
                 selection.append(QItemSelectionRange(index));
             }
         }
    } else if (horizontalMoved) {
        selection.reserve(right - left + 1);
        for (int visual = left; visual <= right; ++visual) {
            int column = d->logicalColumn(visual);
            QModelIndex topLeft = d->model->index(top, column, d->root);
            QModelIndex bottomRight = d->model->index(bottom, column, d->root);
            selection.append(QItemSelectionRange(topLeft, bottomRight));
        }
    } else if (verticalMoved) {
        selection.reserve(bottom - top + 1);
        for (int visual = top; visual <= bottom; ++visual) {
            int row = d->logicalRow(visual);
            QModelIndex topLeft = d->model->index(row, left, d->root);
            QModelIndex bottomRight = d->model->index(row, right, d->root);
            selection.append(QItemSelectionRange(topLeft, bottomRight));
        }
    } else { // nothing moved
        QItemSelectionRange range(tl, br);
        if (!range.isEmpty())
            selection.append(range);
    }

    d->selectionModel->select(selection, command);
}